

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O3

TString * luaS_newlstr(lua_State *L,char *str,size_t l)

{
  int *piVar1;
  uint uVar2;
  global_State *pgVar3;
  long lVar4;
  int iVar5;
  TString *pTVar6;
  size_t sVar7;
  uint h;
  TString **ppTVar8;
  
  if (l < 0x29) {
    pgVar3 = L->l_G;
    h = pgVar3->seed ^ (uint)l;
    if (l != 0) {
      sVar7 = l;
      do {
        lVar4 = sVar7 - 1;
        sVar7 = sVar7 + ~(l >> 5);
        h = h ^ (uint)(byte)str[lVar4] + (h >> 2) + h * 0x20;
      } while (l >> 5 < sVar7);
    }
    uVar2 = (pgVar3->strt).size;
    if ((uVar2 - 1 & uVar2) != 0) {
      __assert_fail("(g->strt.size&(g->strt.size-1))==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstring.c"
                    ,0xab,"TString *internshrstr(lua_State *, const char *, size_t)");
    }
    if (str == (char *)0x0) {
      __assert_fail("str != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstring.c"
                    ,0xac,"TString *internshrstr(lua_State *, const char *, size_t)");
    }
    ppTVar8 = (pgVar3->strt).hash + (int)(uVar2 - 1 & h);
    for (pTVar6 = *ppTVar8; pTVar6 != (TString *)0x0; pTVar6 = (pTVar6->u).hnext) {
      if ((pTVar6->shrlen == l) && (iVar5 = bcmp(str,pTVar6 + 1,l), iVar5 == 0)) {
        if (((pgVar3->currentwhite ^ 0x18) & pTVar6->marked) == 0) {
          return pTVar6;
        }
        pTVar6->marked = pTVar6->marked ^ 0x18;
        return pTVar6;
      }
    }
    if (((int)uVar2 < 0x40000000) && ((int)uVar2 <= (pgVar3->strt).nuse)) {
      luaS_resize(L,uVar2 * 2);
      uVar2 = (pgVar3->strt).size;
      if ((uVar2 - 1 & uVar2) != 0) {
        __assert_fail("(g->strt.size&(g->strt.size-1))==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstring.c"
                      ,0xb8,"TString *internshrstr(lua_State *, const char *, size_t)");
      }
      ppTVar8 = (pgVar3->strt).hash + (int)(uVar2 - 1 & h);
    }
    pTVar6 = createstrobj(L,l,4,h);
    memcpy(pTVar6 + 1,str,l);
    pTVar6->shrlen = (lu_byte)l;
    (pTVar6->u).hnext = *ppTVar8;
    *ppTVar8 = pTVar6;
    piVar1 = &(pgVar3->strt).nuse;
    *piVar1 = *piVar1 + 1;
  }
  else {
    if (0x7fffffffffffffe6 < l) {
      luaM_toobig(L);
    }
    pTVar6 = createstrobj(L,l,0x14,L->l_G->seed);
    (pTVar6->u).lnglen = l;
    memcpy(pTVar6 + 1,str,l);
  }
  return pTVar6;
}

Assistant:

TString *luaS_newlstr (lua_State *L, const char *str, size_t l) {
  if (l <= LUAI_MAXSHORTLEN)  /* short string? */
    return internshrstr(L, str, l);
  else {
    TString *ts;
    if (l >= (MAX_SIZE - sizeof(TString))/sizeof(char))
      luaM_toobig(L);
    ts = luaS_createlngstrobj(L, l);
    memcpy(getstr(ts), str, l * sizeof(char));
    return ts;
  }
}